

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineLibraryCreateInfoKHR *create_info,ScratchAllocator *alloc)

{
  VkPipelineLibraryCreateInfoKHR *pVVar1;
  VkPipeline_T **ppVVar2;
  VkPipelineLibraryCreateInfoKHR *libraries;
  ScratchAllocator *alloc_local;
  VkPipelineLibraryCreateInfoKHR *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkPipelineLibraryCreateInfoKHR>(this,create_info,1,alloc);
  ppVVar2 = copy<VkPipeline_T*>(this,pVVar1->pLibraries,(ulong)pVVar1->libraryCount,alloc);
  pVVar1->pLibraries = ppVVar2;
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineLibraryCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *libraries = copy(create_info, 1, alloc);
	libraries->pLibraries = copy(libraries->pLibraries, libraries->libraryCount, alloc);
	return libraries;
}